

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_device_init_ex(ma_backend *backends,ma_uint32 backendCount,
                           ma_context_config *pContextConfig,ma_device_config *pConfig,
                           ma_device *pDevice)

{
  ma_result mVar1;
  ma_context *pContext;
  long lVar2;
  ulong uVar3;
  ma_backend defaultBackends [15];
  ma_allocation_callbacks local_98;
  ma_backend local_78 [18];
  
  if (pConfig == (ma_device_config *)0x0) {
    mVar1 = -2;
  }
  else {
    if (pContextConfig == (ma_context_config *)0x0) {
      local_98.pUserData = (void *)0x0;
      local_98.onMalloc = ma__malloc_default;
      local_98.onRealloc = ma__realloc_default;
      local_98.onFree = ma__free_default;
    }
    else {
      mVar1 = ma_allocation_callbacks_init_copy(&local_98,&pContextConfig->allocationCallbacks);
      if (mVar1 != 0) {
        return mVar1;
      }
    }
    if (local_98.onMalloc == (_func_void_ptr_size_t_void_ptr *)0x0) {
      if (local_98.onRealloc == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
        pContext = (ma_context *)0x0;
      }
      else {
        pContext = (ma_context *)(*local_98.onRealloc)((void *)0x0,0x3d8,local_98.pUserData);
      }
    }
    else {
      pContext = (ma_context *)(*local_98.onMalloc)(0x3d8,local_98.pUserData);
    }
    if (pContext == (ma_context *)0x0) {
      mVar1 = -4;
    }
    else {
      lVar2 = 0;
      do {
        local_78[lVar2] = (ma_backend)lVar2;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0xf);
      if (backends == (ma_backend *)0x0) {
        backendCount = 0xf;
        backends = local_78;
      }
      if (backendCount == 0) {
        mVar1 = -0x67;
      }
      else {
        uVar3 = (ulong)backendCount;
        do {
          mVar1 = ma_context_init(backends,1,pContextConfig,pContext);
          if (mVar1 == 0) {
            mVar1 = ma_device_init(pContext,pConfig,pDevice);
            if (mVar1 == 0) {
              mVar1 = 0;
              break;
            }
            ma_context_uninit(pContext);
          }
          backends = backends + 1;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      if (mVar1 == 0) {
        pDevice->isOwnerOfContext = '\x01';
        mVar1 = 0;
      }
      else if (local_98.onFree != (_func_void_void_ptr_void_ptr *)0x0) {
        (*local_98.onFree)(pContext,local_98.pUserData);
      }
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_device_init_ex(const ma_backend backends[], ma_uint32 backendCount, const ma_context_config* pContextConfig, const ma_device_config* pConfig, ma_device* pDevice)
{
    ma_result result;
    ma_context* pContext;
    ma_backend defaultBackends[ma_backend_null+1];
    ma_uint32 iBackend;
    ma_backend* pBackendsToIterate;
    ma_uint32 backendsToIterateCount;
    ma_allocation_callbacks allocationCallbacks;

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pContextConfig != NULL) {
        result = ma_allocation_callbacks_init_copy(&allocationCallbacks, &pContextConfig->allocationCallbacks);
        if (result != MA_SUCCESS) {
            return result;
        }
    } else {
        allocationCallbacks = ma_allocation_callbacks_init_default();
    }


    pContext = (ma_context*)ma__malloc_from_callbacks(sizeof(*pContext), &allocationCallbacks);
    if (pContext == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    for (iBackend = 0; iBackend <= ma_backend_null; ++iBackend) {
        defaultBackends[iBackend] = (ma_backend)iBackend;
    }

    pBackendsToIterate = (ma_backend*)backends;
    backendsToIterateCount = backendCount;
    if (pBackendsToIterate == NULL) {
        pBackendsToIterate = (ma_backend*)defaultBackends;
        backendsToIterateCount = ma_countof(defaultBackends);
    }

    result = MA_NO_BACKEND;

    for (iBackend = 0; iBackend < backendsToIterateCount; ++iBackend) {
        result = ma_context_init(&pBackendsToIterate[iBackend], 1, pContextConfig, pContext);
        if (result == MA_SUCCESS) {
            result = ma_device_init(pContext, pConfig, pDevice);
            if (result == MA_SUCCESS) {
                break;  /* Success. */
            } else {
                ma_context_uninit(pContext);   /* Failure. */
            }
        }
    }

    if (result != MA_SUCCESS) {
        ma__free_from_callbacks(pContext, &allocationCallbacks);
        return result;
    }

    pDevice->isOwnerOfContext = MA_TRUE;
    return result;
}